

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O0

Vec_Ptr_t * Nwk_ManDeriveRetimingCut(Aig_Man_t *p,int fForward,int fVerbose)

{
  int iVar1;
  Nwk_Man_t *pMan;
  void *pvVar2;
  int local_3c;
  int i;
  Aig_Obj_t *pObj;
  Nwk_Obj_t *pNode;
  Nwk_Man_t *pNtk;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  int fForward_local;
  Aig_Man_t *p_local;
  
  pMan = Nwk_ManDeriveFromAig(p);
  if (fForward == 0) {
    iVar1 = Aig_ManRegNum(p);
    pNtk = (Nwk_Man_t *)Nwk_ManRetimeCutBackward(pMan,iVar1,fVerbose);
  }
  else {
    iVar1 = Aig_ManRegNum(p);
    pNtk = (Nwk_Man_t *)Nwk_ManRetimeCutForward(pMan,iVar1,fVerbose);
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,local_3c);
    if (pvVar2 != (void *)0x0) {
      *(void **)(*(long *)((long)pvVar2 + 0x28) + 0x10) = pvVar2;
    }
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtk), local_3c < iVar1;
      local_3c = local_3c + 1) {
    pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)pNtk,local_3c);
    Vec_PtrWriteEntry((Vec_Ptr_t *)pNtk,local_3c,*(void **)((long)pvVar2 + 0x10));
  }
  Nwk_ManFree(pMan);
  return (Vec_Ptr_t *)pNtk;
}

Assistant:

Vec_Ptr_t * Nwk_ManDeriveRetimingCut( Aig_Man_t * p, int fForward, int fVerbose )
{ 
    Vec_Ptr_t * vNodes;
    Nwk_Man_t * pNtk;
    Nwk_Obj_t * pNode;
    Aig_Obj_t * pObj;
    int i;
    pNtk = Nwk_ManDeriveFromAig( p );
    if ( fForward )
        vNodes = Nwk_ManRetimeCutForward( pNtk, Aig_ManRegNum(p), fVerbose );
    else
        vNodes = Nwk_ManRetimeCutBackward( pNtk, Aig_ManRegNum(p), fVerbose );
    Aig_ManForEachObj( p, pObj, i )
        ((Nwk_Obj_t *)pObj->pData)->pCopy = pObj;
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pNode, i )
        Vec_PtrWriteEntry( vNodes, i, pNode->pCopy );
    Nwk_ManFree( pNtk );
//    assert( Vec_PtrSize(vNodes) <= Aig_ManRegNum(p) );
    return vNodes;
}